

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O1

void SpookyHash::Short(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  uint *puVar1;
  ulong uVar2;
  uint64 uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar6 = (uint)length & 0x1f;
  uVar7 = (ulong)uVar6;
  uVar3 = *hash1;
  uVar2 = *hash2;
  if (length < 0x10) {
    uVar4 = 0xdeadbeefdeadbeef;
  }
  else {
    uVar4 = length >> 3 & 0xfffffffffffffffc;
    if (uVar4 == 0) {
      uVar4 = 0xdeadbeefdeadbeef;
      uVar8 = 0xdeadbeefdeadbeef;
    }
    else {
      puVar1 = (uint *)((long)message + uVar4 * 8);
      uVar8 = 0xdeadbeefdeadbeef;
      uVar4 = 0xdeadbeefdeadbeef;
      do {
        uVar8 = uVar8 + *(long *)((long)message + 8);
        uVar5 = (uVar4 + *message >> 0xe | uVar4 + *message << 0x32) + uVar8;
        uVar4 = uVar3 ^ uVar5;
        uVar9 = (uVar8 >> 0xc | uVar8 << 0x34) + uVar4;
        uVar2 = uVar2 ^ uVar9;
        uVar4 = (uVar4 >> 0x22 | uVar4 << 0x1e) + uVar2;
        uVar5 = uVar5 ^ uVar4;
        uVar2 = (uVar2 >> 0x17 | uVar2 << 0x29) + uVar5;
        uVar9 = uVar9 ^ uVar2;
        uVar8 = (uVar5 >> 10 | uVar5 << 0x36) + uVar9;
        uVar4 = uVar4 ^ uVar8;
        uVar9 = (uVar9 >> 0x10 | uVar9 << 0x30) + uVar4;
        uVar2 = uVar2 ^ uVar9;
        uVar5 = (uVar4 >> 0x1a | uVar4 << 0x26) + uVar2;
        uVar8 = uVar8 ^ uVar5;
        uVar2 = (uVar2 >> 0x1b | uVar2 << 0x25) + uVar8;
        uVar9 = uVar9 ^ uVar2;
        uVar4 = (uVar8 >> 2 | uVar8 << 0x3e) + uVar9;
        uVar5 = uVar5 ^ uVar4;
        uVar8 = (uVar9 >> 0x1e | uVar9 << 0x22) + uVar5;
        uVar2 = uVar2 ^ uVar8;
        uVar5 = (uVar5 >> 0x3b | uVar5 << 5) + uVar2;
        uVar4 = uVar4 ^ uVar5;
        uVar2 = (uVar2 >> 0x1c | uVar2 << 0x24) + uVar4;
        uVar8 = uVar8 ^ uVar2;
        uVar3 = uVar5 + *(long *)((long)message + 0x10);
        uVar2 = uVar2 + *(long *)((long)message + 0x18);
        message = (void *)((long)message + 0x20);
      } while (message < puVar1);
    }
    if (0xf < uVar6) {
      uVar8 = uVar8 + *(long *)((long)message + 8);
      uVar9 = (uVar4 + *message >> 0xe | uVar4 + *message << 0x32) + uVar8;
      uVar5 = uVar3 ^ uVar9;
      uVar4 = (uVar8 >> 0xc | uVar8 << 0x34) + uVar5;
      uVar2 = uVar2 ^ uVar4;
      uVar5 = (uVar5 >> 0x22 | uVar5 << 0x1e) + uVar2;
      uVar9 = uVar9 ^ uVar5;
      uVar2 = (uVar2 >> 0x17 | uVar2 << 0x29) + uVar9;
      uVar4 = uVar4 ^ uVar2;
      uVar9 = (uVar9 >> 10 | uVar9 << 0x36) + uVar4;
      uVar5 = uVar5 ^ uVar9;
      uVar8 = (uVar4 >> 0x10 | uVar4 << 0x30) + uVar5;
      uVar2 = uVar2 ^ uVar8;
      uVar5 = (uVar5 >> 0x1a | uVar5 << 0x26) + uVar2;
      uVar9 = uVar9 ^ uVar5;
      uVar2 = (uVar2 >> 0x1b | uVar2 << 0x25) + uVar9;
      uVar8 = uVar8 ^ uVar2;
      uVar4 = (uVar9 >> 2 | uVar9 << 0x3e) + uVar8;
      uVar5 = uVar5 ^ uVar4;
      uVar2 = (uVar8 >> 0x1e | uVar8 << 0x22) + uVar5 ^ uVar2;
      uVar3 = (uVar5 >> 0x3b | uVar5 << 5) + uVar2;
      uVar4 = uVar4 ^ uVar3;
      uVar2 = (uVar2 >> 0x1c | uVar2 << 0x24) + uVar4;
      message = (void *)((long)message + 0x10);
      uVar7 = uVar7 - 0x10;
    }
  }
  uVar8 = length << 0x38;
  switch(uVar7) {
  case 0:
    uVar4 = uVar4 + 0xdeadbeefdeadbeef;
    uVar8 = uVar8 + 0xdeadbeefdeadbeef;
    goto switchD_0017bda5_default;
  case 3:
    uVar4 = uVar4 + (ulong)*(byte *)((long)message + 2) * 0x10000;
  case 2:
    uVar4 = uVar4 + (ulong)*(byte *)((long)message + 1) * 0x100;
  case 1:
    uVar7 = (ulong)(byte)*message;
    break;
  case 7:
    uVar4 = uVar4 + ((ulong)*(byte *)((long)message + 6) << 0x30);
  case 6:
    uVar4 = uVar4 + ((ulong)*(byte *)((long)message + 5) << 0x28);
  case 5:
    uVar4 = uVar4 + ((ulong)(byte)*(uint *)((long)message + 4) << 0x20);
  case 4:
    uVar7 = (ulong)*message;
    break;
  case 8:
    goto switchD_0017bda5_caseD_8;
  case 0xb:
    uVar8 = uVar8 | (ulong)*(byte *)((long)message + 10) << 0x10;
  case 10:
    uVar8 = uVar8 + (ulong)*(byte *)((long)message + 9) * 0x100;
  case 9:
    uVar7 = (ulong)(byte)*(uint *)((long)message + 8);
    goto LAB_0017bdfa;
  case 0xf:
    uVar8 = uVar8 | (ulong)*(byte *)((long)message + 0xe) << 0x30;
  case 0xe:
    uVar8 = uVar8 + ((ulong)*(byte *)((long)message + 0xd) << 0x28);
  case 0xd:
    uVar8 = uVar8 + ((ulong)(byte)*(uint *)((long)message + 0xc) << 0x20);
  case 0xc:
    uVar7 = (ulong)*(uint *)((long)message + 8);
LAB_0017bdfa:
    uVar8 = uVar8 + uVar7;
switchD_0017bda5_caseD_8:
    uVar4 = uVar4 + *message;
  default:
    goto switchD_0017bda5_default;
  }
  uVar4 = uVar4 + uVar7;
switchD_0017bda5_default:
  uVar5 = uVar4 >> 0x31 | uVar4 << 0xf;
  uVar7 = (uVar8 ^ uVar4) + uVar5;
  uVar4 = uVar7 >> 0xc | uVar7 << 0x34;
  uVar7 = (uVar3 ^ uVar7) + uVar4;
  uVar9 = uVar7 >> 0x26 | uVar7 * 0x4000000;
  uVar2 = (uVar2 ^ uVar7) + uVar9;
  uVar7 = uVar2 >> 0xd | uVar2 << 0x33;
  uVar2 = (uVar5 ^ uVar2) + uVar7;
  uVar8 = uVar2 >> 0x24 | uVar2 * 0x10000000;
  uVar2 = (uVar4 ^ uVar2) + uVar8;
  uVar4 = uVar2 >> 0x37 | uVar2 * 0x200;
  uVar2 = (uVar9 ^ uVar2) + uVar4;
  uVar5 = uVar2 >> 0x11 | uVar2 << 0x2f;
  uVar2 = (uVar7 ^ uVar2) + uVar5;
  uVar7 = uVar2 >> 10 | uVar2 << 0x36;
  uVar2 = (uVar8 ^ uVar2) + uVar7;
  uVar2 = (uVar2 >> 0x20 | uVar2 << 0x20) + (uVar4 ^ uVar2);
  uVar2 = (uVar2 >> 0x27 | uVar2 * 0x2000000) + (uVar5 ^ uVar2);
  uVar4 = uVar2 >> 1 | uVar2 << 0x3f;
  *hash1 = uVar4;
  *hash2 = (uVar7 ^ uVar2) + uVar4;
  return;
}

Assistant:

void SpookyHash::Short(
    const void *message,
    size_t length,
    uint64 *hash1,
    uint64 *hash2)
{
    uint64 buf[sc_numVars];
    union 
    { 
        const uint8 *p8; 
        uint32 *p32;
        uint64 *p64; 
        size_t i; 
    } u;

    u.p8 = (const uint8 *)message;
    
    if (!ALLOW_UNALIGNED_READS && (u.i & 0x7))
    {
        memcpy(buf, message, length);
        u.p64 = buf;
    }

    size_t remainder = length%32;
    uint64 a=*hash1;
    uint64 b=*hash2;
    uint64 c=sc_const;
    uint64 d=sc_const;

    if (length > 15)
    {
        const uint64 *end = u.p64 + (length/32)*4;
        
        // handle all complete sets of 32 bytes
        for (; u.p64 < end; u.p64 += 4)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            a += u.p64[2];
            b += u.p64[3];
        }
        
        //Handle the case of 16+ remaining bytes.
        if (remainder >= 16)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            u.p64 += 2;
            remainder -= 16;
        }
    }
    
    // Handle the last 0..15 bytes, and its length
    d = ((uint64)length) << 56;
    switch (remainder)
    {
    case 15:
    d += ((uint64)u.p8[14]) << 48;
    case 14:
        d += ((uint64)u.p8[13]) << 40;
    case 13:
        d += ((uint64)u.p8[12]) << 32;
    case 12:
        d += u.p32[2];
        c += u.p64[0];
        break;
    case 11:
        d += ((uint64)u.p8[10]) << 16;
    case 10:
        d += ((uint64)u.p8[9]) << 8;
    case 9:
        d += (uint64)u.p8[8];
    case 8:
        c += u.p64[0];
        break;
    case 7:
        c += ((uint64)u.p8[6]) << 48;
    case 6:
        c += ((uint64)u.p8[5]) << 40;
    case 5:
        c += ((uint64)u.p8[4]) << 32;
    case 4:
        c += u.p32[0];
        break;
    case 3:
        c += ((uint64)u.p8[2]) << 16;
    case 2:
        c += ((uint64)u.p8[1]) << 8;
    case 1:
        c += (uint64)u.p8[0];
        break;
    case 0:
        c += sc_const;
        d += sc_const;
    }
    ShortEnd(a,b,c,d);
    *hash1 = a;
    *hash2 = b;
}